

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.cc
# Opt level: O1

bool __thiscall re2c::Opt::source(Opt *this,char *s)

{
  char *pcVar1;
  
  pcVar1 = this->source_file;
  if (pcVar1 == (char *)0x0) {
    this->source_file = s;
  }
  else {
    error("multiple source files: %s, %s",pcVar1);
  }
  return pcVar1 == (char *)0x0;
}

Assistant:

bool Opt::source (const char * s)
{
	if (source_file)
	{
		error ("multiple source files: %s, %s", source_file, s);
		return false;
	}
	else
	{
		source_file = s;
		return true;
	}
}